

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorExtend.cpp
# Opt level: O1

void __thiscall HFactor::addRows(HFactor *this,HighsSparseMatrix *ar_matrix)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  long lVar1;
  HighsInt *pHVar2;
  pointer piVar3;
  pointer piVar4;
  iterator iVar5;
  iterator iVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<double,std::allocator<double>> *this_02;
  HighsInt HVar10;
  MatrixFormat MVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  size_type sVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  size_type __n;
  int iVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  HighsInt u_countX;
  vector<int,_std::allocator<int>_> ur_temp;
  HighsSparseMatrix new_lr_rows;
  vector<int,_std::allocator<int>_> in_basis;
  HighsSparseMatrix new_lr_cols;
  HVector rhs;
  double local_248;
  int local_240;
  int local_23c;
  vector<double,std::allocator<double>> *local_238;
  vector<int,std::allocator<int>> *local_230;
  ulong local_228;
  ulong local_220;
  pointer local_218;
  vector<int,_std::allocator<int>_> *local_210;
  ulong local_208;
  vector<int,_std::allocator<int>_> *local_200;
  vector<int,_std::allocator<int>_> local_1f8;
  undefined1 local_1d8 [64];
  vector<int,_std::allocator<int>_> local_198;
  vector<double,_std::allocator<double>_> local_180;
  vector<int,_std::allocator<int>_> local_168;
  HighsSparseMatrix local_150;
  HVectorBase<double> local_e0;
  
  invalidAMatrixAction(this);
  uVar14 = ar_matrix->num_row_;
  uVar16 = (ulong)uVar14;
  local_208 = (ulong)(uint)this->num_row;
  local_228 = (ulong)(this->num_row + uVar14);
  printf("Adding %d new rows to HFactor instance: increasing dimension from %d to %d \n",uVar16);
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.size = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&local_168,(long)this->num_col,&local_e0.size);
  if (0 < this->num_row) {
    pHVar2 = this->basic_index;
    lVar15 = 0;
    do {
      if (pHVar2[lVar15] < this->num_col) {
        local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[pHVar2[lVar15]] = (int)lVar15;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < this->num_row);
  }
  HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)local_1d8);
  local_1d8._0_4_ = kRowwise;
  local_1d8._4_4_ = this->num_row;
  local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HVectorBase<double>::setup(&local_e0,local_1d8._4_4_);
  local_200 = &this->lr_start;
  local_210 = (vector<int,_std::allocator<int>_> *)(long)((int)local_228 + 1);
  std::vector<int,_std::allocator<int>_>::reserve(local_200,(size_type)local_210);
  local_220 = uVar16;
  if (0 < (int)uVar14) {
    local_230 = (vector<int,std::allocator<int>> *)&this->lr_index;
    local_238 = (vector<double,std::allocator<double>> *)&this->lr_value;
    local_248 = 0.0;
    uVar16 = 0;
    do {
      HVectorBase<double>::clear(&local_e0);
      local_e0.packFlag = true;
      piVar3 = (ar_matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar15 = (long)piVar3[uVar16];
      uVar18 = uVar16 + 1;
      if (piVar3[uVar16] < piVar3[uVar16 + 1]) {
        piVar4 = (ar_matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar12 = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar4[lVar15]];
          if (-1 < (long)iVar12) {
            local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar12] =
                 (ar_matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15];
            lVar22 = (long)local_e0.count;
            local_e0.count = local_e0.count + 1;
            local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar22] = iVar12;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < piVar3[uVar18]);
      }
      btranU(this,&local_e0,local_248,(HighsTimerClock *)0x0);
      local_218 = (pointer)(((double)local_e0.count / (double)this->num_row) * 0.05);
      HVectorBase<double>::tight(&local_e0);
      HVar10 = local_e0.count;
      lVar15 = (long)local_e0.count;
      if (0 < lVar15) {
        lVar22 = 0;
        do {
          local_150.format_ =
               local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar22];
          if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_198,
                       (iterator)
                       local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_150);
          }
          else {
            *local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar22];
            local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_180,
                       (iterator)
                       local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + (int)local_150.format_);
          }
          else {
            *local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)local_150.format_];
            local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          lVar22 = lVar22 + 1;
        } while (lVar15 != lVar22);
      }
      MVar11 = (MatrixFormat)
               ((ulong)((long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
      if (local_1d8._24_8_ == local_1d8._32_8_) {
        local_150.format_ = MVar11;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)(local_1d8 + 0x10),
                   (iterator)local_1d8._24_8_,(int *)&local_150);
      }
      else {
        *(MatrixFormat *)local_1d8._24_8_ = MVar11;
        local_1d8._24_8_ = local_1d8._24_8_ + 4;
      }
      local_1d8._8_4_ = local_1d8._8_4_ + 1;
      if (0 < HVar10) {
        lVar22 = 0;
        do {
          local_150.format_ =
               local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar22];
          iVar5._M_current =
               (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_230,iVar5,(int *)&local_150);
          }
          else {
            *iVar5._M_current = local_150.format_;
            (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar6._M_current =
               (this->lr_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->lr_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (local_238,iVar6,
                       local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + (int)local_150.format_);
          }
          else {
            *iVar6._M_current =
                 local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)local_150.format_];
            (this->lr_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
          lVar22 = lVar22 + 1;
        } while (lVar15 != lVar22);
      }
      local_150.format_ =
           (MatrixFormat)
           ((ulong)((long)(this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
      iVar5._M_current =
           (this->lr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->lr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_200,iVar5,(int *)&local_150);
      }
      else {
        *iVar5._M_current = local_150.format_;
        (this->lr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_248 = local_248 * 0.95 + (double)local_218;
      uVar16 = uVar18;
    } while (uVar18 != local_220);
  }
  local_150.num_row_ = local_1d8._8_4_;
  local_150.num_col_ = local_1d8._4_4_;
  local_150.format_ = local_1d8._0_4_;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_150.start_,(vector<int,_std::allocator<int>_> *)(local_1d8 + 0x10));
  std::vector<int,_std::allocator<int>_>::vector
            (&local_150.p_end_,(vector<int,_std::allocator<int>_> *)(local_1d8 + 0x28));
  uVar16 = local_220;
  std::vector<int,_std::allocator<int>_>::vector(&local_150.index_,&local_198);
  std::vector<double,_std::allocator<double>_>::vector(&local_150.value_,&local_180);
  HighsSparseMatrix::ensureColwise(&local_150);
  this_00 = &this->l_pivot_index;
  iVar13 = (int)local_228;
  local_200 = (vector<int,_std::allocator<int>_> *)(long)iVar13;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(size_type)local_200);
  auVar9 = _DAT_003c57d0;
  auVar8 = _DAT_003c57c0;
  lVar15 = (long)(int)local_208;
  iVar12 = this->num_row;
  if (iVar12 < iVar13) {
    lVar22 = (long)iVar12;
    piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar20 = ((int)uVar16 + lVar15) - lVar22;
    lVar21 = lVar20 + -1;
    auVar26._8_4_ = (int)lVar21;
    auVar26._0_8_ = lVar21;
    auVar26._12_4_ = (int)((ulong)lVar21 >> 0x20);
    uVar18 = 0;
    auVar26 = auVar26 ^ _DAT_003c57d0;
    do {
      auVar30._8_4_ = (int)uVar18;
      auVar30._0_8_ = uVar18;
      auVar30._12_4_ = (int)(uVar18 >> 0x20);
      auVar30 = (auVar30 | auVar8) ^ auVar9;
      bVar7 = auVar26._0_4_ < auVar30._0_4_;
      iVar13 = auVar26._4_4_;
      iVar24 = auVar30._4_4_;
      if ((bool)(~(iVar13 < iVar24 || iVar24 == iVar13 && bVar7) & 1)) {
        piVar3[lVar22 + uVar18] = iVar12;
      }
      if (iVar13 >= iVar24 && (iVar24 != iVar13 || !bVar7)) {
        piVar3[lVar22 + uVar18 + 1] = iVar12 + 1;
      }
      uVar18 = uVar18 + 2;
      iVar12 = iVar12 + 2;
    } while ((lVar20 + 1U & 0xfffffffffffffffe) != uVar18);
  }
  piVar3 = (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar4 = (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_01 = &this->l_start;
  std::vector<int,_std::allocator<int>_>::resize(this_01,(size_type)local_210);
  auVar26 = _DAT_003c57d0;
  auVar9 = _DAT_003c57c0;
  auVar8 = _DAT_003c57b0;
  uVar18 = (ulong)((long)piVar3 - (long)piVar4) >> 2;
  lVar22 = (long)this->num_row;
  iVar12 = (int)uVar18;
  if (this->num_row < (int)local_228) {
    piVar3 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar20 = ((int)uVar16 + lVar15) - lVar22;
    lVar21 = lVar20 + -1;
    auVar27._8_4_ = (int)lVar21;
    auVar27._0_8_ = lVar21;
    auVar27._12_4_ = (int)((ulong)lVar21 >> 0x20);
    uVar16 = 0;
    auVar27 = auVar27 ^ _DAT_003c57d0;
    do {
      auVar31._8_4_ = (int)uVar16;
      auVar31._0_8_ = uVar16;
      auVar31._12_4_ = (int)(uVar16 >> 0x20);
      auVar30 = (auVar31 | auVar9) ^ auVar26;
      iVar13 = auVar27._4_4_;
      if ((bool)(~(iVar13 < auVar30._4_4_ ||
                  auVar27._0_4_ < auVar30._0_4_ && auVar30._4_4_ == iVar13) & 1)) {
        piVar3[lVar22 + uVar16 + 1] = iVar12;
      }
      if (auVar30._12_4_ <= auVar27._12_4_ &&
          (auVar30._8_4_ <= auVar27._8_4_ || auVar30._12_4_ != auVar27._12_4_)) {
        piVar3[lVar22 + uVar16 + 2] = iVar12;
      }
      auVar30 = (auVar31 | auVar8) ^ auVar26;
      iVar24 = auVar30._4_4_;
      if (iVar24 <= iVar13 && (iVar24 != iVar13 || auVar30._0_4_ <= auVar27._0_4_)) {
        piVar3[lVar22 + uVar16 + 3] = iVar12;
        piVar3[lVar22 + uVar16 + 4] = iVar12;
      }
      uVar16 = uVar16 + 4;
    } while ((lVar20 + 3U & 0xfffffffffffffffc) != uVar16);
  }
  local_210 = this_00;
  local_208 = lVar15;
  std::vector<int,_std::allocator<int>_>::resize(&this->l_index,(long)iVar12);
  std::vector<double,_std::allocator<double>_>::resize(&this->l_value,(long)iVar12);
  if (0 < (long)this->num_row) {
    piVar3 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_230 = (vector<int,std::allocator<int>> *)
                ((this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + -1);
    local_238 = (vector<double,std::allocator<double>> *)
                (local_150.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + -1);
    local_218 = local_150.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + -1;
    lVar15 = (long)this->num_row;
    do {
      lVar22 = lVar15 + -1;
      iVar12 = piVar3[lVar15];
      lVar20 = (long)iVar12;
      iVar13 = (int)uVar18;
      piVar3[lVar15] = iVar13;
      lVar21 = (long)local_150.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15];
      if (local_150.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar15 + -1] <
          local_150.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar15]) {
        lVar23 = 0;
        do {
          piVar4[(long)iVar13 + lVar23 + -1] =
               *(int *)(local_238 + lVar23 * 4 + lVar21 * 4) + this->num_row;
          *(double *)(local_230 + lVar23 * 8 + (long)iVar13 * 8) = local_218[lVar21 + lVar23];
          lVar1 = lVar21 + lVar23;
          lVar23 = lVar23 + -1;
        } while ((long)local_150.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar22] < lVar1 + -1);
        uVar18 = (ulong)(uint)(iVar13 + (int)lVar23);
      }
      if (piVar3[lVar22] < iVar12) {
        iVar12 = (int)uVar18;
        lVar21 = 0;
        do {
          piVar4[(long)iVar12 + lVar21 + -1] = piVar4[lVar20 + lVar21 + -1];
          *(undefined8 *)(local_230 + lVar21 * 8 + (long)iVar12 * 8) =
               *(undefined8 *)(local_230 + lVar21 * 8 + lVar20 * 8);
          lVar23 = lVar20 + lVar21;
          lVar21 = lVar21 + -1;
        } while ((long)piVar3[lVar22] < lVar23 + -1);
        uVar18 = (ulong)(uint)(iVar12 + (int)lVar21);
      }
      bVar7 = 1 < lVar15;
      lVar15 = lVar22;
    } while (bVar7);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->l_pivot_lookup,(size_type)local_200);
  iVar12 = this->num_row;
  if (iVar12 < (int)local_228) {
    piVar3 = (this->l_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (local_210->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = 0;
    do {
      piVar3[piVar4[iVar12 + lVar15]] = iVar12 + (int)lVar15;
      lVar15 = lVar15 + 1;
    } while ((local_208 + (long)(int)local_220) - (long)iVar12 != lVar15);
  }
  local_23c = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_240 = this->num_row;
  if (local_240 < (int)local_228) {
    local_238 = (vector<double,std::allocator<double>> *)&this->u_pivot_index;
    iVar12 = (int)((ulong)((long)(this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2) - local_240;
    local_230 = (vector<int,std::allocator<int>> *)&this->u_pivot_lookup;
    do {
      iVar13 = local_240 + iVar12;
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,iVar13);
      iVar5._M_current =
           (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_230,iVar5,(int *)&local_1f8);
      }
      else {
        *iVar5._M_current = iVar13;
        (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar5._M_current =
           (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)local_238,iVar5,&local_240);
      }
      else {
        *iVar5._M_current = local_240;
        (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x3ff0000000000000;
      iVar6._M_current =
           (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->u_pivot_value,iVar6,(double *)&local_1f8);
      }
      else {
        *iVar6._M_current = 1.0;
        (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      iVar5._M_current =
           (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->u_start,iVar5,&local_23c);
      }
      else {
        *iVar5._M_current = local_23c;
        (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar5._M_current =
           (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->u_last_p,iVar5,&local_23c);
      }
      else {
        *iVar5._M_current = local_23c;
        (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_240 = local_240 + 1;
    } while (local_240 < (int)local_228);
  }
  iVar12 = (uint)(this->update_method == 1) * 5;
  uVar16 = (ulong)((long)(this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  local_230 = (vector<int,std::allocator<int>> *)CONCAT44(local_230._4_4_,iVar12);
  iVar13 = (int)local_220;
  iVar24 = (int)uVar16;
  iVar12 = iVar12 * iVar13 + iVar24;
  std::vector<int,_std::allocator<int>_>::resize(&this->ur_index,(long)iVar12);
  std::vector<double,_std::allocator<double>_>::resize(&this->ur_value,(long)iVar12);
  local_218 = (pointer)CONCAT44(local_218._4_4_,iVar12);
  local_228 = (long)(this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
  iVar12 = (int)(local_228 >> 2);
  printf("\nUpdating UR vectors %d - %d\n",local_228 >> 2 & 0xffffffff,
         (ulong)((iVar13 + iVar12) - 1));
  local_238 = (vector<double,std::allocator<double>> *)&this->ur_start;
  std::vector<int,_std::allocator<int>_>::resize(&this->ur_start,(long)(iVar13 + iVar12 + 1));
  auVar26 = _DAT_003c57d0;
  auVar9 = _DAT_003c57c0;
  auVar8 = _DAT_003c57b0;
  uVar14 = iVar13 + iVar12;
  uVar17 = iVar12 + 1;
  lVar15 = (long)(int)uVar17;
  if (0 < iVar13) {
    piVar3 = (((_Vector_base<int,_std::allocator<int>_> *)&local_238->field_0x0)->_M_impl).
             super__Vector_impl_data._M_start;
    uVar25 = uVar17;
    if ((int)uVar17 < (int)uVar14) {
      uVar25 = uVar14;
    }
    lVar22 = (int)uVar25 - lVar15;
    auVar28._8_4_ = (int)lVar22;
    auVar28._0_8_ = lVar22;
    auVar28._12_4_ = (int)((ulong)lVar22 >> 0x20);
    uVar18 = 0;
    auVar28 = auVar28 ^ _DAT_003c57d0;
    do {
      auVar32._8_4_ = (int)uVar18;
      auVar32._0_8_ = uVar18;
      auVar32._12_4_ = (int)(uVar18 >> 0x20);
      auVar30 = (auVar32 | auVar9) ^ auVar26;
      iVar13 = auVar28._4_4_;
      if ((bool)(~(auVar30._4_4_ == iVar13 && auVar28._0_4_ < auVar30._0_4_ ||
                  iVar13 < auVar30._4_4_) & 1)) {
        piVar3[lVar15 + uVar18] = iVar24;
      }
      if ((auVar30._12_4_ != auVar28._12_4_ || auVar30._8_4_ <= auVar28._8_4_) &&
          auVar30._12_4_ <= auVar28._12_4_) {
        piVar3[lVar15 + uVar18 + 1] = iVar24;
      }
      auVar30 = (auVar32 | auVar8) ^ auVar26;
      iVar34 = auVar30._4_4_;
      if (iVar34 <= iVar13 && (iVar34 != iVar13 || auVar30._0_4_ <= auVar28._0_4_)) {
        piVar3[lVar15 + uVar18 + 2] = iVar24;
        piVar3[lVar15 + uVar18 + 3] = iVar24;
      }
      uVar18 = uVar18 + 4;
    } while ((lVar22 + 4U & 0xfffffffffffffffc) != uVar18);
  }
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __n = (size_type)(int)uVar14;
  local_240 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_1f8,__n,&local_240);
  std::vector<int,_std::allocator<int>_>::resize(&this->ur_space,__n);
  this_02 = local_238;
  auVar26 = _DAT_003c57d0;
  auVar9 = _DAT_003c57c0;
  auVar8 = _DAT_003c57b0;
  if (0 < (int)local_220) {
    piVar3 = (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar22 = (long)iVar12;
    sVar19 = lVar22 + 1U;
    if ((long)(lVar22 + 1U) < (long)__n) {
      sVar19 = __n;
    }
    lVar20 = (sVar19 - lVar22) + -1;
    auVar29._8_4_ = (int)lVar20;
    auVar29._0_8_ = lVar20;
    auVar29._12_4_ = (int)((ulong)lVar20 >> 0x20);
    uVar18 = 0;
    auVar29 = auVar29 ^ _DAT_003c57d0;
    do {
      auVar33._8_4_ = (int)uVar18;
      auVar33._0_8_ = uVar18;
      auVar33._12_4_ = (int)(uVar18 >> 0x20);
      auVar30 = (auVar33 | auVar9) ^ auVar26;
      iVar13 = auVar29._4_4_;
      if ((bool)(~(auVar30._4_4_ == iVar13 && auVar29._0_4_ < auVar30._0_4_ ||
                  iVar13 < auVar30._4_4_) & 1)) {
        piVar3[lVar22 + uVar18] = (int)local_230;
      }
      if ((auVar30._12_4_ != auVar29._12_4_ || auVar30._8_4_ <= auVar29._8_4_) &&
          auVar30._12_4_ <= auVar29._12_4_) {
        piVar3[lVar22 + uVar18 + 1] = (int)local_230;
      }
      auVar30 = (auVar33 | auVar8) ^ auVar26;
      iVar34 = auVar30._4_4_;
      if (iVar34 <= iVar13 && (iVar34 != iVar13 || auVar30._0_4_ <= auVar29._0_4_)) {
        piVar3[lVar22 + uVar18 + 2] = (int)local_230;
        piVar3[lVar22 + uVar18 + 3] = (int)local_230;
      }
      uVar18 = uVar18 + 4;
    } while (((sVar19 - lVar22) + 3 & 0xfffffffffffffffc) != uVar18);
  }
  if (0 < local_23c) {
    piVar3 = (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar22 = 0;
    do {
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar3[piVar4[lVar22]]] =
           local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar3[piVar4[lVar22]]] + 1;
      lVar22 = lVar22 + 1;
    } while (lVar22 < local_23c);
  }
  *(int *)((long)(((_Vector_base<int,_std::allocator<int>_> *)&local_238->field_0x0)->_M_impl).
                 super__Vector_impl_data._M_start + ((long)(local_228 << 0x1e) >> 0x1e)) = iVar24;
  if (0 < (int)local_220) {
    lVar15 = lVar15 + -1;
    do {
      uVar14 = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15] + (int)local_230;
      uVar25 = (int)uVar16 + uVar14;
      uVar16 = (ulong)uVar25;
      (((_Vector_base<int,_std::allocator<int>_> *)&this_02->field_0x0)->_M_impl).
      super__Vector_impl_data._M_start[lVar15 + 1] = uVar25;
      printf("ur_start[%d] = %d; gap = %d; iStart = %d\n",(ulong)uVar17,(ulong)uVar25,(ulong)uVar14,
             uVar16);
      lVar15 = lVar15 + 1;
      uVar17 = uVar17 + 1;
    } while (lVar15 < (long)__n);
  }
  printf("ur_count_size = %d; iStart%d\n",(ulong)local_218 & 0xffffffff,uVar16 & 0xffffffff);
  std::vector<int,_std::allocator<int>_>::resize((vector<int,_std::allocator<int>_> *)this_02,__n);
  std::vector<int,_std::allocator<int>_>::resize(&this->ur_lastp,__n);
  if (0 < (int)local_220) {
    piVar3 = (((_Vector_base<int,_std::allocator<int>_> *)&this_02->field_0x0)->_M_impl).
             super__Vector_impl_data._M_start;
    piVar4 = (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = (long)iVar12;
    do {
      piVar4[lVar15] = piVar3[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 < (long)__n);
  }
  this->num_row = this->num_row + (int)local_220;
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_150.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_150.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_150.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_150.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_150.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_150.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_150.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1d8._40_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._40_8_);
  }
  if ((pointer)local_1d8._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._16_8_);
  }
  if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HFactor::addRows(const HighsSparseMatrix* ar_matrix) {
  invalidAMatrixAction();
  assert(kExtendInvertWhenAddingRows);
  HighsInt num_new_row = ar_matrix->num_row_;
  HighsInt new_num_row = num_row + num_new_row;
  printf("Adding %" HIGHSINT_FORMAT
         " new rows to HFactor instance: increasing dimension from "
         "%" HIGHSINT_FORMAT " to %" HIGHSINT_FORMAT " \n",
         num_new_row, num_row, new_num_row);

  // Need to know where (if) a column is basic
  vector<HighsInt> in_basis;
  in_basis.assign(num_col, -1);
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt iVar = basic_index[iRow];
    if (iVar < num_col) in_basis[iVar] = iRow;
  }
  for (HighsInt iRow = num_row; iRow < new_num_row; iRow++) {
    HighsInt iVar = basic_index[iRow];
    assert(iVar >= num_col);
  }
  //  reportLu(kReportLuBoth, true);
  //  reportLu(kReportLuJustL);

  // Create a row-wise sparse matrix containing the new rows of the L
  // matrix - so that a column-wise version can be created (after
  // inserting the rows into the LR matrix) allowing the cew column
  // entries to be inserted efficiently into the L matrix
  HighsSparseMatrix new_lr_rows;
  new_lr_rows.format_ = MatrixFormat::kRowwise;
  new_lr_rows.num_col_ = num_row;
  double expected_density = 0.0;
  HVector rhs;
  rhs.setup(num_row);
  this->lr_start.reserve(new_num_row + 1);
  for (HighsInt inewRow = 0; inewRow < num_new_row; inewRow++) {
    //    printf("\nFor new row %" HIGHSINT_FORMAT "\n", inewRow);
    // Prepare RHS for system U^T.v = r
    rhs.clear();
    rhs.packFlag = true;
    for (HighsInt iEl = ar_matrix->start_[inewRow];
         iEl < ar_matrix->start_[inewRow + 1]; iEl++) {
      HighsInt iCol = ar_matrix->index_[iEl];
      HighsInt basis_index = in_basis[iCol];
      if (basis_index >= 0) {
        rhs.array[basis_index] = ar_matrix->value_[iEl];
        rhs.index[rhs.count++] = basis_index;
      }
    }
    // Solve U^T.v = r
    btranU(rhs, expected_density);
    double local_density = (1.0 * rhs.count) / num_row;
    expected_density = kRunningAverageMultiplier * local_density +
                       (1 - kRunningAverageMultiplier) * expected_density;
    //    printf("New row btranU density: local = %11.4g; expected =  %11.4g\n",
    //    local_density, expected_density);
    rhs.tight();
    //
    // Append v to the matrix containing the new rows of L
    HighsInt rhs_num_nz = rhs.count;
    //    printf("New row has entries:\n");
    for (HighsInt iX = 0; iX < rhs_num_nz; iX++) {
      HighsInt iCol = rhs.index[iX];
      new_lr_rows.index_.push_back(iCol);
      new_lr_rows.value_.push_back(rhs.array[iCol]);
      //      printf("   %4d, %11.4g\n", (int)iCol, rhs.array[iCol]);
    }
    new_lr_rows.start_.push_back(new_lr_rows.index_.size());
    new_lr_rows.num_row_++;

    //
    // Append v to the L matrix
    for (HighsInt iX = 0; iX < rhs_num_nz; iX++) {
      HighsInt iCol = rhs.index[iX];
      lr_index.push_back(iCol);
      lr_value.push_back(rhs.array[iCol]);
    }
    lr_start.push_back(lr_index.size());
    //    reportLu(kReportLuJustL);
  }
  // Now create a column-wise copy of the new rows
  HighsSparseMatrix new_lr_cols = new_lr_rows;
  new_lr_cols.ensureColwise();
  //
  // Insert the column-wise copy into the L matrix
  //
  // Add pivot indices for the new columns
  this->l_pivot_index.resize(new_num_row);
  for (HighsInt iCol = num_row; iCol < new_num_row; iCol++)
    l_pivot_index[iCol] = iCol;
  //
  // Add starts for the identity columns
  HighsInt l_matrix_new_num_nz = lr_index.size();
  assert(l_matrix_new_num_nz ==
         (HighsInt)(l_index.size() + new_lr_cols.index_.size()));
  l_start.resize(new_num_row + 1);
  HighsInt to_el = l_matrix_new_num_nz;
  for (HighsInt iCol = num_row + 1; iCol < new_num_row + 1; iCol++)
    l_start[iCol] = l_matrix_new_num_nz;
  //
  // Insert the new entries, remembering to offset the index values by
  // num_row, since new_lr_cols only has the new rows
  l_index.resize(l_matrix_new_num_nz);
  l_value.resize(l_matrix_new_num_nz);
  for (HighsInt iCol = num_row - 1; iCol >= 0; iCol--) {
    const HighsInt from_el = l_start[iCol + 1];
    l_start[iCol + 1] = to_el;
    for (HighsInt iEl = new_lr_cols.start_[iCol + 1] - 1;
         iEl >= new_lr_cols.start_[iCol]; iEl--) {
      to_el--;
      l_index[to_el] = num_row + new_lr_cols.index_[iEl];
      l_value[to_el] = new_lr_cols.value_[iEl];
    }
    for (HighsInt iEl = from_el - 1; iEl >= l_start[iCol]; iEl--) {
      to_el--;
      l_index[to_el] = l_index[iEl];
      l_value[to_el] = l_value[iEl];
    }
  }
  assert(to_el == 0);
  this->l_pivot_lookup.resize(new_num_row);
  for (HighsInt iRow = num_row; iRow < new_num_row; iRow++)
    l_pivot_lookup[l_pivot_index[iRow]] = iRow;
  // Now update the U matrix with identity rows and columns
  // Allocate space for U factor
  //  reportLu(kReportLuJustL);
  //
  // Now add pivots corresponding to identity columns in U. The use of
  // most arrays in U is self-evident, except for U(R)lastp, which is
  // (one more than) the end of the index/value array that's applied
  // in the *tranU. Here it needs to be equal to the start since there
  // are no non-pivotal entries
  //

  HighsInt u_countX = u_index.size();
  HighsInt u_pivot_lookup_offset = u_pivot_index.size() - num_row;
  for (HighsInt iRow = num_row; iRow < new_num_row; iRow++) {
    u_pivot_lookup.push_back(u_pivot_lookup_offset + iRow);
    u_pivot_index.push_back(iRow);
    u_pivot_value.push_back(1);
    u_start.push_back(u_countX);
    u_last_p.push_back(u_countX);
  }

  // Now, to extend UR
  //
  // UR space
  //
  // Borrowing names from buildFinish()
  HighsInt ur_stuff_size = update_method == kUpdateMethodFt ? 5 : 0;
  HighsInt ur_size = ur_index.size();
  HighsInt ur_count_size = ur_size + ur_stuff_size * num_new_row;
  ur_index.resize(ur_count_size);
  ur_value.resize(ur_count_size);

  // Need to refer to just the new UR vectors
  HighsInt ur_cur_num_vec = ur_start.size();
  HighsInt ur_new_num_vec = ur_cur_num_vec + num_new_row;
  printf("\nUpdating UR vectors %d - %d\n", (int)ur_cur_num_vec,
         (int)ur_new_num_vec - 1);
  // UR pointer
  //
  // Allow space to the start of new rows, including the start for the
  // fictitious ur_new_num_vec'th row
  ur_start.resize(ur_new_num_vec + 1);
  for (HighsInt iRow = ur_cur_num_vec + 1; iRow < ur_new_num_vec + 1; iRow++) {
    ur_start[iRow] = ur_size;
  }
  // NB ur_temp plays the role of ur_lastp when it could be used as
  // temporary storage in buildFinish()
  vector<HighsInt> ur_temp;
  ur_temp.assign(ur_new_num_vec, 0);
  //
  // ur_space has its new entries assigned (to ur_stuff_size) as in
  // buildFinish()
  ur_space.resize(ur_new_num_vec);
  for (HighsInt iRow = ur_cur_num_vec; iRow < ur_new_num_vec; iRow++)
    ur_space[iRow] = ur_stuff_size;
  // Compute ur_temp exactly as in buildFinish()
  for (HighsInt k = 0; k < u_countX; k++) ur_temp[u_pivot_lookup[u_index[k]]]++;
  HighsInt iStart = ur_size;
  ur_start[ur_cur_num_vec] = iStart;
  for (HighsInt iRow = ur_cur_num_vec + 1; iRow < ur_new_num_vec + 1; iRow++) {
    HighsInt gap = ur_temp[iRow - 1] + ur_stuff_size;
    ur_start[iRow] = iStart + gap;
    iStart += gap;
    printf("ur_start[%d] = %d; gap = %d; iStart = %d\n", (int)iRow,
           (int)ur_start[iRow], (int)gap, (int)iStart);
  }
  printf("ur_count_size = %d; iStart%d\n", (int)ur_count_size, (int)iStart);
  // Lose the start for the fictitious ur_new_num_vec'th row
  ur_start.resize(ur_new_num_vec);
  // Resize ur_lastp and initialise its new entries to be the ur_start
  // values since the rows are empty
  ur_lastp.resize(ur_new_num_vec);
  for (HighsInt iRow = ur_cur_num_vec; iRow < ur_new_num_vec; iRow++)
    ur_lastp[iRow] = ur_start[iRow];
  //
  // Increase the number of rows in HFactor
  num_row += num_new_row;
  //  reportLu(kReportLuBoth, true);
}